

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amha_star.hpp
# Opt level: O0

bool __thiscall
csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::
improvePath(AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
            *this)

{
  double *pdVar1;
  __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  double dVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  size_type sVar6;
  void *this_01;
  element_type *peVar7;
  reference this_02;
  element_type *peVar8;
  mapped_type *pmVar9;
  reference pvVar10;
  double dVar11;
  undefined1 local_100 [16];
  undefined1 local_f0 [8];
  SearchVertexPtr least_cost_vertex_1;
  undefined1 local_d0 [32];
  undefined1 local_b0 [8];
  SearchVertexPtr least_cost_vertex;
  Heap<double> local_80;
  shared_ptr<csbpl_common::Heap<double>::Element> local_68;
  int local_54;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_50;
  int i;
  duration<long,_std::ratio<1L,_1000000000L>_> local_48;
  duration<double,_std::ratio<1L,_1L>_> local_40;
  rep_conflict local_38;
  double time_elapsed;
  value_type_conflict1 local_1c;
  AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double> *local_18;
  AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double> *this_local;
  
  local_1c = 0;
  local_18 = this;
  std::vector<int,_std::allocator<int>_>::push_back
            (&(this->anytime_stats_).num_expansions_,&local_1c);
  poVar5 = std::operator<<((ostream *)&std::cout,"[AMHAStar::improvePath] Improve path iteration: ")
  ;
  sVar6 = std::vector<int,_std::allocator<int>_>::size(&(this->anytime_stats_).num_expansions_);
  this_01 = (void *)std::ostream::operator<<(poVar5,sVar6);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  while( true ) {
    csbpl_common::Heap<double>::top((Heap<double> *)&time_elapsed);
    peVar7 = std::
             __shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&time_elapsed);
    dVar2 = peVar7->key_;
    dVar11 = std::numeric_limits<double>::infinity();
    std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr
              ((shared_ptr<csbpl_common::Heap<double>::Element> *)&time_elapsed);
    if (dVar11 <= dVar2) {
      iVar4 = csbpl_common::Heap<double>::size
                        (&(this->
                          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                          ).open_);
      if (iVar4 == 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "[AMHAStar::improvePath] Open list is empty! Error... ");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      return iVar4 != 0;
    }
    tStack_50.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_48.__r = (rep)std::chrono::operator-
                                  (&stack0xffffffffffffffb0,
                                   &(this->
                                    super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                    ).params_.start_time_);
    local_40.__r = (rep_conflict)
                   std::chrono::
                   duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                             (&local_48);
    local_38 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_40);
    pdVar1 = &(this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              ).params_.time_limit_;
    if (*pdVar1 <= local_38 && local_38 != *pdVar1) break;
    for (local_54 = 0;
        local_54 <
        (this->
        super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
        params_.num_inad_; local_54 = local_54 + 1) {
      this_02 = std::
                vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>::
                operator[](&this->open_inad_,(long)local_54);
      iVar4 = csbpl_common::Heap<double>::size(this_02);
      local_80.data_.
      super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      bVar3 = false;
      if (0 < iVar4) {
        std::vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>::
        operator[](&this->open_inad_,(long)local_54);
        csbpl_common::Heap<double>::top((Heap<double> *)&local_68);
        local_80.data_.
        super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        peVar7 = std::
                 __shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&local_68);
        dVar2 = peVar7->key_;
        dVar11 = (this->
                 super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                 ).params_.mha_eps_;
        csbpl_common::Heap<double>::top(&local_80);
        peVar7 = std::
                 __shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&local_80);
        bVar3 = dVar2 <= dVar11 * peVar7->key_;
        std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr
                  ((shared_ptr<csbpl_common::Heap<double>::Element> *)&local_80);
      }
      if ((local_80.data_.
           super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr(&local_68);
      }
      if (bVar3) {
        peVar8 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&(this->
                                  super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                  ).goal_vertex_);
        dVar2 = peVar8->g_cost_;
        std::vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>::
        operator[](&this->open_inad_,(long)local_54);
        csbpl_common::Heap<double>::top
                  ((Heap<double> *)
                   &least_cost_vertex.
                    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        peVar7 = std::
                 __shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&least_cost_vertex.
                                  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        dVar11 = peVar7->key_;
        std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr
                  ((shared_ptr<csbpl_common::Heap<double>::Element> *)
                   &least_cost_vertex.
                    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        if (dVar2 < dVar11) {
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "[AMHAStar::improvePath] Goal node expanded. Premature termiation!"
                                  );
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          return true;
        }
        std::vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>::
        operator[](&this->open_inad_,(long)local_54);
        csbpl_common::Heap<double>::top((Heap<double> *)local_d0);
        this_00 = (__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)(local_d0 + 0x10);
        std::
        static_pointer_cast<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,csbpl_common::Heap<double>::Element>
                  ((shared_ptr<csbpl_common::Heap<double>::Element> *)this_00);
        peVar8 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(this_00);
        std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::
        shared_ptr((shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> *
                   )local_b0,&peVar8->self_ptr_);
        std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::
        ~shared_ptr((shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>
                     *)this_00);
        std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr
                  ((shared_ptr<csbpl_common::Heap<double>::Element> *)local_d0);
        (*(this->
          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>)
          ._vptr_Dijkstra[3])
                  (this,(shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>
                         *)local_b0);
        peVar8 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_b0);
        pmVar9 = std::
                 unordered_map<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_sliding_puzzle::SlidingPuzzleState::Compare,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>_>
                 ::operator[](&this->closed_inad_,&peVar8->state_);
        *pmVar9 = true;
        pvVar10 = std::vector<int,_std::allocator<int>_>::back
                            (&(this->anytime_stats_).num_expansions_);
        *pvVar10 = *pvVar10 + 1;
        std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::
        ~shared_ptr((shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>
                     *)local_b0);
      }
      else {
        peVar8 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&(this->
                                  super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                  ).goal_vertex_);
        dVar2 = peVar8->g_cost_;
        csbpl_common::Heap<double>::top
                  ((Heap<double> *)
                   &least_cost_vertex_1.
                    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        peVar7 = std::
                 __shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&least_cost_vertex_1.
                                  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        dVar11 = peVar7->key_;
        std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr
                  ((shared_ptr<csbpl_common::Heap<double>::Element> *)
                   &least_cost_vertex_1.
                    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        if (dVar2 < dVar11) {
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "[AMHAStar::improvePath] Goal node expanded. Premature termiation!"
                                  );
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          return true;
        }
        csbpl_common::Heap<double>::top((Heap<double> *)local_100);
        std::
        static_pointer_cast<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,csbpl_common::Heap<double>::Element>
                  ((shared_ptr<csbpl_common::Heap<double>::Element> *)local_f0);
        std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr
                  ((shared_ptr<csbpl_common::Heap<double>::Element> *)local_100);
        (*(this->
          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>)
          ._vptr_Dijkstra[3])(this,(shared_ptr<csbpl_common::Heap<double>::Element> *)local_f0);
        peVar8 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_f0);
        pmVar9 = std::
                 unordered_map<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_sliding_puzzle::SlidingPuzzleState::Compare,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>_>
                 ::operator[](&(this->
                               super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                               ).closed_,&peVar8->state_);
        *pmVar9 = true;
        pvVar10 = std::vector<int,_std::allocator<int>_>::back
                            (&(this->anytime_stats_).num_expansions_);
        *pvVar10 = *pvVar10 + 1;
        std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::
        ~shared_ptr((shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>
                     *)local_f0);
      }
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "[AMHAStar::improvePath] Time limit exceeded... Exiting!");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  return false;
}

Assistant:

virtual bool improvePath()
    {
#if DEBUG
      int num_expansions = 0;
  double nearest_node_to_goal_dist = std::numeric_limits<double>::infinity();
  SearchVertexPtr nearest_node_to_goal;
#endif
      this->anytime_stats_.num_expansions_.push_back(0);
      std::cout << "[AMHAStar::improvePath] Improve path iteration: "
                << this->anytime_stats_.num_expansions_.size() << std::endl;
      while (this->open_.top()->key_ < std::numeric_limits<double>::infinity())
      {
        
        double time_elapsed =
          duration_cast<duration<double> >(Clock::now() -
                                           this->params_.start_time_).count();
        
        if (time_elapsed > this->params_.time_limit_)
        {
          std::cout << "[AMHAStar::improvePath] Time limit exceeded..."
                       " Exiting!" << std::endl;
          return false;
        }
        
        for (int i=0; i<this->params_.num_inad_; ++i)
        {
          if (open_inad_[i].size() > 0 &&
              open_inad_[i].top()->key_ <= this->params_.mha_eps_*this->open_.top()->key_)
          {
            if (this->goal_vertex_->g_cost_ < open_inad_[i].top()->key_)
            {
              std::cout << "[AMHAStar::improvePath] Goal node expanded. "
                           "Premature termiation!" << std::endl;
              return true;
            }
            else
            {
              SearchVertexPtr least_cost_vertex =
                std::static_pointer_cast<SearchVertex>(open_inad_[i].top())->self_ptr_;
              expand(least_cost_vertex);
              closed_inad_[least_cost_vertex->state_] = true;
              ++this->anytime_stats_.num_expansions_.back();
#if DEBUG
              ++num_expansions;
#endif
            }
          }
          else
          {
            if (this->goal_vertex_->g_cost_ < this->open_.top()->key_)
            {
              std::cout << "[AMHAStar::improvePath] Goal node expanded. "
                           "Premature termiation!" << std::endl;
              return true;
            }
            else
            {
              SearchVertexPtr least_cost_vertex =
                std::static_pointer_cast<SearchVertex>(this->open_.top());
              expand(least_cost_vertex);
              this->closed_[least_cost_vertex->state_] = true;
              ++this->anytime_stats_.num_expansions_.back();
#if DEBUG
              ++num_expansions;
#endif
            }
          }
        }
      }

#if DEBUG
      std::cout << "[AMHAStar::improvePath] Total number of expansions: "
                << num_expansions << std::endl;
#endif
      
      
      if (this->open_.size() == 0)
      {
#if DEBUG
        std::cout << "[AMHAStar::improvePath] Open list is empty! Error... "
                     "Returning nearest node reached" << std::endl;
        this->env_ptr_->goal_ = nearest_node_to_goal->state_;
        return true;
#endif
        std::cout << "[AMHAStar::improvePath] Open list is empty! Error... " << std::endl;
        return false;
      }
      
      return true;
    }